

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_rcu_list.h
# Opt level: O2

void __thiscall
libguarded::
rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
::rcu_guard::unlock(rcu_guard *this)

{
  node *pnVar1;
  __pointer_type pzVar2;
  __pointer_type pzVar3;
  
  pzVar3 = (this->m_zombie->next)._M_b._M_p;
  for (pzVar2 = pzVar3; pzVar2 != (__pointer_type)0x0; pzVar2 = (pzVar2->next)._M_b._M_p) {
    if ((pzVar2->owner)._M_b._M_p != (__pointer_type)0x0) goto LAB_0010704b;
  }
  while (pzVar3 != (__pointer_type)0x0) {
    pnVar1 = pzVar3->zombie_node;
    if (pnVar1 != (node *)0x0) {
      CsSignal::SignalBase::ConnectStruct::~ConnectStruct(&pnVar1->data);
      operator_delete(pnVar1,0x38);
    }
    pzVar2 = (pzVar3->next)._M_b._M_p;
    operator_delete(pzVar3,0x18);
    pzVar3 = pzVar2;
  }
  LOCK();
  (this->m_zombie->next)._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
LAB_0010704b:
  LOCK();
  (this->m_zombie->owner)._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  return;
}

Assistant:

void rcu_list<T, M, Alloc>::rcu_guard::unlock()
{
   zombie_list_node *cached_next = m_zombie->next.load();
   zombie_list_node *n           = cached_next;

   bool last = true;

   while (n) {
      if (n->owner.load() != nullptr) {
         last = false;
         break;
      }

      n = n->next.load();
   }

   n = cached_next;

   if (last) {
      while (n) {
         node *deadNode = n->zombie_node;

         if (deadNode != nullptr) {
            node_alloc_trait::destroy(m_list->m_node_alloc, deadNode);
            node_alloc_trait::deallocate(m_list->m_node_alloc, deadNode, 1);
         }

         zombie_list_node *oldnode = n;
         n = n->next.load();

         if (oldnode != nullptr) {
            zombie_alloc_trait::destroy(m_list->m_zombie_alloc, oldnode);
            zombie_alloc_trait::deallocate(m_list->m_zombie_alloc, oldnode, 1);
         }
      }

      m_zombie->next.store(n);
   }

   m_zombie->owner.store(nullptr);
}